

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_manager.cpp
# Opt level: O3

void __thiscall
duckdb::ConnectionManager::RemoveConnection(ConnectionManager *this,ClientContext *context)

{
  pointer puVar1;
  int iVar2;
  DatabaseInstance *pDVar3;
  pointer pEVar4;
  unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
  *callback;
  pointer this_00;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    pDVar3 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&context->db);
    puVar1 = (pDVar3->config).extension_callbacks.
             super_vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (pDVar3->config).extension_callbacks.
                   super_vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1;
        this_00 = this_00 + 1) {
      pEVar4 = unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
               ::operator->(this_00);
      (**(code **)(*(long *)pEVar4 + 0x18))(pEVar4,context);
    }
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::ClientContext>,_std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::ClientContext>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&(this->connections)._M_h);
    LOCK();
    (this->connection_count).super___atomic_base<unsigned_long>._M_i =
         (this->connections)._M_h._M_element_count;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

void ConnectionManager::RemoveConnection(ClientContext &context) {
	lock_guard<mutex> lock(connections_lock);
	for (auto &callback : DBConfig::GetConfig(context).extension_callbacks) {
		callback->OnConnectionClosed(context);
	}
	connections.erase(context);
	connection_count = connections.size();
}